

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O0

char * bcwrite_bytecode(BCWriteCtx *ctx,char *p,GCproto *pt)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  BCReg rd;
  BCOp op;
  MSize i;
  jit_State *J;
  uint8_t *q;
  MSize nbc;
  GCproto *pt_local;
  char *p_local;
  BCWriteCtx *ctx_local;
  
  uVar3 = pt->sizebc - 1;
  uVar4 = uVar3 * 4;
  memcpy(p,(void *)((long)&pt[1].nextgc.gcptr64 + 4),(ulong)uVar4);
  if (((pt->flags & 0x10) != 0) || (pt->trace != 0)) {
    lVar2 = *(long *)(((ctx->sb).L.ptr64 & 0xfffffffffffffff8) + 0x10);
    J = (jit_State *)p;
    for (rd = 0; rd < uVar3; rd = rd + 1) {
      cVar1 = (char)(J->cur).nextgc.gcptr64;
      if ((((cVar1 == 'P') || (cVar1 == 'S')) || (cVar1 == 'V')) || (cVar1 == 'N')) {
        *(char *)&(J->cur).nextgc.gcptr64 = cVar1 + -1;
      }
      else if (((cVar1 == 'Q') || (cVar1 == 'T')) || (cVar1 == 'W')) {
        *(undefined4 *)&(J->cur).nextgc.gcptr64 =
             *(undefined4 *)
              (*(long *)(*(long *)(lVar2 + 0x460) +
                        (ulong)((uint)*(byte *)((long)&(J->cur).nextgc.gcptr64 + 2) +
                               (uint)*(byte *)((long)&(J->cur).nextgc.gcptr64 + 3) * 0x100) * 8) +
              0x50);
      }
      J = (jit_State *)((long)&(J->cur).nextgc.gcptr64 + 4);
    }
  }
  return p + uVar4;
}

Assistant:

static char *bcwrite_bytecode(BCWriteCtx *ctx, char *p, GCproto *pt)
{
  MSize nbc = pt->sizebc-1;  /* Omit the [JI]FUNC* header. */
#if LJ_HASJIT
  uint8_t *q = (uint8_t *)p;
#endif
  p = lj_buf_wmem(p, proto_bc(pt)+1, nbc*(MSize)sizeof(BCIns));
  UNUSED(ctx);
#if LJ_HASJIT
  /* Unpatch modified bytecode containing ILOOP/JLOOP etc. */
  if ((pt->flags & PROTO_ILOOP) || pt->trace) {
    jit_State *J = L2J(sbufL(&ctx->sb));
    MSize i;
    for (i = 0; i < nbc; i++, q += sizeof(BCIns)) {
      BCOp op = (BCOp)q[LJ_ENDIAN_SELECT(0, 3)];
      if (op == BC_IFORL || op == BC_IITERL || op == BC_ILOOP ||
	  op == BC_JFORI) {
	q[LJ_ENDIAN_SELECT(0, 3)] = (uint8_t)(op-BC_IFORL+BC_FORL);
      } else if (op == BC_JFORL || op == BC_JITERL || op == BC_JLOOP) {
	BCReg rd = q[LJ_ENDIAN_SELECT(2, 1)] + (q[LJ_ENDIAN_SELECT(3, 0)] << 8);
	memcpy(q, &traceref(J, rd)->startins, 4);
      }
    }
  }
#endif
  return p;
}